

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CaffeConverter.cpp
# Opt level: O3

void CoreMLConverter::convertCaffeNetwork
               (NetParameter *caffeSpecWeights,NetParameter *caffeSpecProto,
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_caffe::BlobProto,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_caffe::BlobProto>_>_>
               *meanImageBlobProto,Model *modelSpec,
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
               *isBGR,map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
                      *redBias,
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
               *blueBias,
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
               *greenBias,
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
               *grayBias,
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
               *scale,set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *imageInputs,string *classInputPath,string *predictedFeatureName)

{
  int iVar1;
  NeuralNetworkClassifier *this;
  NeuralNetwork *this_00;
  runtime_error *this_01;
  NeuralNetwork *unaff_RBX;
  
  if ((caffeSpecProto->layers_).super_RepeatedPtrFieldBase.current_size_ == 0) {
    if ((caffeSpecWeights->layers_).super_RepeatedPtrFieldBase.current_size_ == 0) {
      iVar1 = std::__cxx11::string::compare((char *)classInputPath);
      if (iVar1 == 0) {
        if (modelSpec->_oneof_case_[0] == 500) {
          this_00 = (NeuralNetwork *)(modelSpec->Type_).pipelineclassifier_;
        }
        else {
          CoreML::Specification::Model::clear_Type(modelSpec);
          modelSpec->_oneof_case_[0] = 500;
          this_00 = (NeuralNetwork *)operator_new(0x58);
          CoreML::Specification::NeuralNetwork::NeuralNetwork(this_00);
          (modelSpec->Type_).neuralnetwork_ = this_00;
        }
        _convertCaffeNetwork<CoreML::Specification::NeuralNetwork>
                  (caffeSpecWeights,caffeSpecProto,meanImageBlobProto,modelSpec,imageInputs,isBGR,
                   redBias,blueBias,greenBias,grayBias,scale,(string *)this_00,(string *)redBias,
                   unaff_RBX);
      }
      else {
        if (modelSpec->_oneof_case_[0] == 0x193) {
          this = (modelSpec->Type_).neuralnetworkclassifier_;
        }
        else {
          CoreML::Specification::Model::clear_Type(modelSpec);
          modelSpec->_oneof_case_[0] = 0x193;
          this = (NeuralNetworkClassifier *)operator_new(0x68);
          CoreML::Specification::NeuralNetworkClassifier::NeuralNetworkClassifier(this);
          (modelSpec->Type_).neuralnetworkclassifier_ = this;
        }
        _convertCaffeNetwork<CoreML::Specification::NeuralNetworkClassifier>
                  (caffeSpecWeights,caffeSpecProto,meanImageBlobProto,modelSpec,imageInputs,isBGR,
                   redBias,blueBias,greenBias,grayBias,scale,classInputPath,predictedFeatureName,
                   this);
      }
      return;
    }
    this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error
              (this_01,"Caffemodel file is not version 2. Please save this model using Caffe V2.");
  }
  else {
    this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error
              (this_01,
               "Caffe prototxt file is not version 2. Please save this model using Caffe V2.");
  }
  __cxa_throw(this_01,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void CoreMLConverter::convertCaffeNetwork(caffe::NetParameter& caffeSpecWeights,
                                          caffe::NetParameter& caffeSpecProto,
                                          std::map<std::string, caffe::BlobProto>& meanImageBlobProto,
                                          Specification::Model& modelSpec,
                                          const std::map<std::string, bool>& isBGR,
                                          const std::map<std::string, double>& redBias,
                                          const std::map<std::string, double>& blueBias,
                                          const std::map<std::string, double>& greenBias,
                                          const std::map<std::string, double>& grayBias,
                                          const std::map<std::string, double>& scale,
                                          const std::set<std::string>& imageInputs,
                                          const std::string& classInputPath,
                                          const std::string& predictedFeatureName) {
    
    
    // Currently, we don't support caffe V1 or V0.
    if (caffeSpecProto.layers_size() != 0) {
        throw std::runtime_error("Caffe prototxt file is not version 2. Please save this model using Caffe V2.");
    }
    if (caffeSpecWeights.layers_size() != 0) {
        throw std::runtime_error("Caffemodel file is not version 2. Please save this model using Caffe V2.");
    }
    
    if (classInputPath != "") {
        // we have class labels, produce a classifier
        _convertCaffeNetwork(caffeSpecWeights,
                             caffeSpecProto,
                             meanImageBlobProto,
                             modelSpec,
                             imageInputs,
                             isBGR,
                             redBias,
                             blueBias,
                             greenBias,
                             grayBias,
                             scale,
                             classInputPath,
                             predictedFeatureName,
                             modelSpec.mutable_neuralnetworkclassifier());
    } else {
        _convertCaffeNetwork(caffeSpecWeights,
                             caffeSpecProto,
                             meanImageBlobProto,
                             modelSpec,
                             imageInputs,
                             isBGR,
                             redBias,
                             blueBias,
                             greenBias,
                             grayBias,
                             scale,
                             classInputPath,
                             predictedFeatureName,
                             modelSpec.mutable_neuralnetwork());
    }
}